

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O1

optional<unsigned_int> *
tinyusdz::value::TryGetTypeId(optional<unsigned_int> *__return_storage_ptr__,string *tyname)

{
  pointer pcVar1;
  long lVar2;
  const_iterator cVar3;
  uint uVar4;
  storage_t<unsigned_int> sVar5;
  bool bVar6;
  string s;
  map<mapbox::eternal::impl::element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_>,_57UL>
  tyidmap;
  long *local_5e8;
  ulong local_5e0;
  long local_5d8 [2];
  key_type local_5c8;
  ulong local_5c0;
  long local_5b8 [2];
  long *local_5a8;
  ulong local_5a0;
  long local_598 [2];
  map<mapbox::eternal::impl::element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_>,_57UL>
  local_588;
  
  memcpy(&local_588,&PTR_anon_var_dwarf_4e616d_00212fe8,0x558);
  pcVar1 = (tyname->_M_dataplus)._M_p;
  local_5e8 = local_5d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5e8,pcVar1,pcVar1 + tyname->_M_string_length);
  local_5c8.data_ = (char *)local_5b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c8,"[]","");
  if (tyname->_M_string_length < local_5c0) {
    bVar6 = false;
  }
  else {
    lVar2 = std::__cxx11::string::find
                      ((char *)tyname,(ulong)local_5c8.data_,tyname->_M_string_length - local_5c0);
    bVar6 = lVar2 != -1;
  }
  if ((long *)local_5c8.data_ != local_5b8) {
    operator_delete(local_5c8.data_,local_5b8[0] + 1);
  }
  sVar5 = (storage_t<unsigned_int>)0x0;
  uVar4 = 0;
  if (bVar6) {
    local_5a8 = local_598;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,"[]","");
    if ((local_5e0 < local_5a0) ||
       (lVar2 = std::__cxx11::string::find
                          ((char *)&local_5e8,(ulong)local_5a8,local_5e0 - local_5a0), lVar2 == -1))
    {
      local_5c8.data_ = (char *)local_5b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_5c8,local_5e8,(long)local_5e8 + local_5e0);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_5c8,(ulong)&local_5e8);
    }
    std::__cxx11::string::operator=((string *)&local_5e8,(string *)&local_5c8);
    if ((long *)local_5c8.data_ != local_5b8) {
      operator_delete(local_5c8.data_,local_5b8[0] + 1);
    }
    if (local_5a8 != local_598) {
      operator_delete(local_5a8,local_598[0] + 1);
    }
    uVar4 = 0x100000;
  }
  local_5c8.data_ = (char *)local_5e8;
  cVar3 = mapbox::eternal::impl::
          map<mapbox::eternal::impl::element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_>,_57UL>
          ::find(&local_588,&local_5c8);
  if (cVar3.pos !=
      (element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_> *)
      &stack0xffffffffffffffd0) {
    sVar5 = (storage_t<unsigned_int>)
            (uVar4 | ((cVar3.pos)->super_element<mapbox::eternal::string,_unsigned_int>).pair.second
            );
  }
  __return_storage_ptr__->has_value_ =
       cVar3.pos !=
       (element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_> *)
       &stack0xffffffffffffffd0;
  __return_storage_ptr__->contained = sVar5;
  if (local_5e8 != local_5d8) {
    operator_delete(local_5e8,local_5d8[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<uint32_t> TryGetTypeId(const std::string &tyname) {
  MAPBOX_ETERNAL_CONSTEXPR const auto tyidmap =
      mapbox::eternal::hash_map<mapbox::eternal::string, uint32_t>({
          {kToken, TYPE_ID_TOKEN},
          {kString, TYPE_ID_STRING},
          {kPath, TYPE_ID_STRING},
          {kAssetPath, TYPE_ID_ASSET_PATH},
          {kDictionary, TYPE_ID_DICT},
          {kTimeCode, TYPE_ID_TIMECODE},
          {kBool, TYPE_ID_BOOL},
          {kUChar, TYPE_ID_UCHAR},
          {kHalf, TYPE_ID_HALF},
          {kInt, TYPE_ID_INT32},
          {kUInt, TYPE_ID_UINT32},
          {kInt64, TYPE_ID_INT64},
          {kUInt64, TYPE_ID_UINT64},
          {kInt2, TYPE_ID_INT2},
          {kInt3, TYPE_ID_INT3},
          {kInt4, TYPE_ID_INT4},
          {kUInt2, TYPE_ID_UINT2},
          {kUInt3, TYPE_ID_UINT3},
          {kUInt4, TYPE_ID_UINT4},
          {kHalf2, TYPE_ID_HALF2},
          {kHalf3, TYPE_ID_HALF3},
          {kHalf4, TYPE_ID_HALF4},
          {kMatrix2d, TYPE_ID_MATRIX2D},
          {kMatrix3d, TYPE_ID_MATRIX3D},
          {kMatrix4d, TYPE_ID_MATRIX4D},
          {kFloat, TYPE_ID_FLOAT},
          {kFloat2, TYPE_ID_FLOAT2},
          {kFloat3, TYPE_ID_FLOAT3},
          {kFloat4, TYPE_ID_FLOAT4},
          {kDouble, TYPE_ID_DOUBLE},
          {kDouble2, TYPE_ID_DOUBLE2},
          {kDouble3, TYPE_ID_DOUBLE3},
          {kDouble4, TYPE_ID_DOUBLE4},
          {kQuath, TYPE_ID_QUATH},
          {kQuatf, TYPE_ID_QUATF},
          {kQuatd, TYPE_ID_QUATD},
          {kVector3h, TYPE_ID_VECTOR3H},
          {kVector3f, TYPE_ID_VECTOR3F},
          {kVector3d, TYPE_ID_VECTOR3D},
          {kPoint3h, TYPE_ID_POINT3H},
          {kPoint3f, TYPE_ID_POINT3F},
          {kPoint3d, TYPE_ID_POINT3D},
          {kNormal3h, TYPE_ID_NORMAL3H},
          {kNormal3f, TYPE_ID_NORMAL3F},
          {kNormal3d, TYPE_ID_NORMAL3D},
          {kColor3f, TYPE_ID_COLOR3F},
          {kColor3d, TYPE_ID_COLOR3D},
          {kColor4f, TYPE_ID_COLOR4F},
          {kColor4d, TYPE_ID_COLOR4D},
          {kFrame4d, TYPE_ID_FRAME4D},
          {kTexCoord2h, TYPE_ID_TEXCOORD2H},
          {kTexCoord2f, TYPE_ID_TEXCOORD2F},
          {kTexCoord2d, TYPE_ID_TEXCOORD2D},
          {kTexCoord3h, TYPE_ID_TEXCOORD3H},
          {kTexCoord3f, TYPE_ID_TEXCOORD3F},
          {kTexCoord3d, TYPE_ID_TEXCOORD3D},
          {kRelationship, TYPE_ID_RELATIONSHIP},
      });

  std::string s = tyname;
  uint32_t array_bit = 0;
  if (endsWith(tyname, "[]")) {
    s = removeSuffix(s, "[]");
    array_bit |= TYPE_ID_1D_ARRAY_BIT;
  }

  // It looks USD does not support 2D array type, so no further `[]` check

  auto ret = tyidmap.find(s.c_str());
  if (ret != tyidmap.end()) {
    return ret->second | array_bit;
  }

  return nonstd::nullopt;
}